

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O3

ion_status_t linear_hash_get(ion_byte_t *key,ion_byte_t *value,linear_hash_table_t *linear_hash)

{
  byte *pbVar1;
  int iVar2;
  FILE *pFVar3;
  ion_dictionary_compare_t p_Var4;
  byte bVar5;
  char cVar6;
  undefined1 *__dest;
  undefined1 *__dest_00;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  int iVar10;
  uint uVar11;
  undefined1 *__s;
  int iVar12;
  ion_fpos_t iVar13;
  long lVar14;
  undefined8 uStack_80;
  undefined1 local_78 [8];
  linear_hash_bucket_t bucket;
  int local_38;
  
  iVar10 = (linear_hash->super).record.key_size;
  if (iVar10 < 2) {
    uVar11 = 0;
    if (linear_hash->next_split < 1) goto LAB_00112f23;
    iVar10 = linear_hash->initial_size;
  }
  else {
    uVar7 = (ulong)(iVar10 - 1);
    uVar8 = 0;
    uVar11 = 0;
    iVar10 = 3;
    do {
      pbVar1 = key + uVar8;
      lVar14 = uVar8 + 1;
      uVar8 = uVar8 + 1;
      uVar11 = uVar11 + (key_bytes_to_int::coefficients[lVar14] - iVar10) * (uint)*pbVar1;
      iVar10 = key_bytes_to_int::coefficients[lVar14];
    } while (uVar7 != uVar8);
    iVar10 = linear_hash->initial_size;
    uVar11 = iVar10 - 1U & uVar11;
    if (linear_hash->next_split <= (int)uVar11) goto LAB_00112f23;
    uVar8 = 0;
    uVar11 = 0;
    iVar12 = 3;
    do {
      pbVar1 = key + uVar8;
      lVar14 = uVar8 + 1;
      uVar8 = uVar8 + 1;
      uVar11 = uVar11 + (key_bytes_to_int::coefficients[lVar14] - iVar12) * (uint)*pbVar1;
      iVar12 = key_bytes_to_int::coefficients[lVar14];
    } while (uVar7 != uVar8);
  }
  uVar11 = uVar11 & iVar10 * 2 - 1U;
LAB_00112f23:
  iVar13 = -1;
  if ((int)uVar11 < linear_hash->bucket_map->current_size) {
    iVar13 = linear_hash->bucket_map->data[(int)uVar11];
  }
  uStack_80 = 0x112f4c;
  bVar5 = linear_hash_get_bucket(iVar13,(linear_hash_bucket_t *)local_78,linear_hash);
  if (bVar5 == 0) {
    __dest = local_78 + -((long)(linear_hash->super).record.key_size + 0xfU & 0xfffffffffffffff0);
    __dest_00 = __dest + -((long)(linear_hash->super).record.value_size + 0xfU & 0xfffffffffffffff0)
    ;
    sVar9 = (long)linear_hash->records_per_bucket * linear_hash->record_total_size;
    __s = __dest_00 + -(sVar9 + 0xf & 0xfffffffffffffff0);
    bucket.overflow_location = (ion_fpos_t)key;
    *(undefined8 *)(__s + -8) = 0x112fb6;
    memset(__s,0,sVar9);
    do {
      pFVar3 = (FILE *)linear_hash->database;
      *(undefined8 *)(__s + -8) = 0x112fc8;
      fseek(pFVar3,iVar13 + 0x10,0);
      iVar10 = linear_hash->records_per_bucket;
      sVar9 = linear_hash->record_total_size;
      pFVar3 = (FILE *)linear_hash->database;
      *(undefined8 *)(__s + -8) = 0x112fdd;
      fread(__s,sVar9,(long)iVar10,pFVar3);
      local_38 = linear_hash->records_per_bucket;
      if (0 < local_38) {
        lVar14 = 0;
        iVar10 = 0;
        do {
          iVar12 = (linear_hash->super).record.key_size;
          cVar6 = __s[lVar14];
          *(undefined8 *)(__s + -8) = 0x113018;
          memcpy(__dest,__s + lVar14 + 1,(long)iVar12);
          iVar2 = (linear_hash->super).record.value_size;
          *(undefined8 *)(__s + -8) = 0x11302c;
          memcpy(__dest_00,__s + iVar12 + lVar14 + 1,(long)iVar2);
          iVar13 = bucket.overflow_location;
          if (cVar6 != '\0') {
            p_Var4 = (linear_hash->super).compare;
            *(undefined8 *)(__s + -8) = 0x113041;
            cVar6 = (*p_Var4)(__dest,(ion_key_t)iVar13,iVar12);
            if (cVar6 == '\0') {
              iVar10 = (linear_hash->super).record.value_size;
              *(undefined8 *)(__s + -8) = 0x11308e;
              memcpy(value,__dest_00,(long)iVar10);
              uVar7 = 0x100000000;
              bVar5 = 0;
              goto LAB_0011309a;
            }
            local_38 = linear_hash->records_per_bucket;
          }
          lVar14 = lVar14 + linear_hash->record_total_size;
          iVar10 = iVar10 + 1;
        } while (iVar10 < local_38);
      }
      iVar13 = bucket._0_8_;
      if (bucket._0_8_ == -1) {
        bVar5 = 1;
        break;
      }
      *(undefined8 *)(__s + -8) = 0x113070;
      bVar5 = linear_hash_get_bucket(iVar13,(linear_hash_bucket_t *)local_78,linear_hash);
    } while (bVar5 == 0);
  }
  uVar7 = 0;
LAB_0011309a:
  return (ion_status_t)(bVar5 | uVar7);
}

Assistant:

ion_status_t
linear_hash_get(
	ion_byte_t			*key,
	ion_byte_t			*value,
	linear_hash_table_t *linear_hash
) {
	/* status for result count */
	ion_status_t status = ION_STATUS_INITIALIZE;
	/* get the index of the bucket to read */
	int bucket_idx		= insert_hash_to_bucket(key, linear_hash);

	if (bucket_idx < linear_hash->next_split) {
		bucket_idx = hash_to_bucket(key, linear_hash);
	}

	/* get the bucket where the record would be located */
	ion_fpos_t				bucket_loc = bucket_idx_to_ion_fpos_t(bucket_idx, linear_hash);
	linear_hash_bucket_t	bucket;

	status.error = linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

	if (status.error != err_ok) {
		return status;
	}

	/* create a linear_hash_record with the desired key, value, and status of full*/
	ion_byte_t	*record_key		= alloca(linear_hash->super.record.key_size);
	ion_byte_t	*record_value	= alloca(linear_hash->super.record.value_size);
	ion_byte_t	record_status	= linear_hash_record_status_empty;

	int found					= boolean_false;
	int i;

	ion_byte_t *records			= alloca(linear_hash->record_total_size * linear_hash->records_per_bucket);

	memset(records, 0, linear_hash->record_total_size * linear_hash->records_per_bucket);

	ion_fpos_t		record_offset	= 0;
	ion_fpos_t		record_loc;
	ion_boolean_t	terminal		= boolean_false;

	while (terminal == boolean_false && found == boolean_false) {
		record_loc = bucket_loc + sizeof(linear_hash_bucket_t);
		fseek(linear_hash->database, bucket_loc + sizeof(linear_hash_bucket_t), SEEK_SET);
		fread(records, linear_hash->record_total_size, linear_hash->records_per_bucket, linear_hash->database);

		for (i = 0; i < linear_hash->records_per_bucket; i++) {
			memcpy(&record_status, records + record_offset, sizeof(record_status));
			memcpy(record_key, records + record_offset + sizeof(record_status), linear_hash->super.record.key_size);
			memcpy(record_value, records + record_offset + sizeof(record_status) + linear_hash->super.record.key_size, linear_hash->super.record.value_size);

			if (record_status != 0) {
				if (linear_hash->super.compare(record_key, key, linear_hash->super.record.key_size) == 0) {
					status.count++;
					memcpy(value, record_value, linear_hash->super.record.value_size);
					found = 1;
					break;
				}
			}

			record_offset	+= linear_hash->record_total_size;
			record_loc		+= linear_hash->record_total_size;
		}

		if (found == boolean_false) {
			if (bucket.overflow_location == linear_hash_end_of_list) {
				terminal = boolean_true;
			}
			else {
				record_offset	= 0;
				bucket_loc		= bucket.overflow_location;
				status.error	= linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

				if (status.error != err_ok) {
					return status;
				}
			}
		}
	}

	if (status.count == 0) {
		status.error = err_item_not_found;
	}
	else {
		status.error = err_ok;
	}

	return status;
}